

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

bool __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::checkResult
          (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *this,uint expectedValue,
          uint expectedBorderColor,GLint layer)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> resultData;
  allocator_type local_49;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x78))(0x8ca8,this->m_fbo_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error binding framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x2dd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,
             (ulong)((this->m_test_configuration).m_height * (this->m_test_configuration).m_width *
                    (this->m_test_configuration).m_n_out_components),&local_49);
  (**(code **)(lVar4 + 0x1220))
            (0,0,(this->m_test_configuration).m_width,(this->m_test_configuration).m_height,
             (this->m_test_configuration).m_output_format,(this->m_test_configuration).m_output_type
             ,local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error reading pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x2ea);
  bVar1 = true;
  if ((this->m_test_configuration).m_filtering == 0x2600) {
    bVar1 = checkNearest(this,&local_48,expectedValue,expectedBorderColor,layer);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkResult(OutputType expectedValue,
																		   OutputType expectedBorderColor,
																		   glw::GLint layer)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind draw framebuffer to read framebuffer */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object!");

	std::vector<OutputType> resultData(m_test_configuration.get_width() * m_test_configuration.get_height() *
									   m_test_configuration.get_n_out_components());

	/* Read data from framebuffer */
	gl.readPixels(0,										/* x */
				  0,										/* y */
				  m_test_configuration.get_width(),			/* width */
				  m_test_configuration.get_height(),		/* height */
				  m_test_configuration.get_output_format(), /* format */
				  m_test_configuration.get_output_type(),   /* type */
				  &resultData[0]);							/* data */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixels from color buffer");

	/* Choose comparision method depending on filtering mode */
	if (m_test_configuration.get_filtering() == GL_NEAREST)
	{
		return checkNearest(resultData, expectedValue, expectedBorderColor, layer);
	}
	else
	{
		return checkLinear(resultData, layer);
	}
}